

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::Array<char32_t>_> * __thiscall
kj::anon_unknown_0::encodeUtf<char32_t>
          (EncodingResult<kj::Array<char32_t>_> *__return_storage_ptr__,anon_unknown_0 *this,
          ArrayPtr<const_char> text,bool nulTerminate)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  byte *pbVar4;
  char32_t *pcVar5;
  char *pcVar6;
  ushort uVar7;
  bool bVar8;
  Array<char32_t> local_a0;
  int local_84 [2];
  char32_t local_7c;
  byte local_77;
  byte local_76;
  byte local_75;
  char32_t u_2;
  char16_t cStack_70;
  byte c4;
  byte c3_1;
  byte c2_2;
  char16_t u_1;
  byte c3;
  byte c2_1;
  char16_t u;
  byte c2;
  byte local_59;
  size_t sStack_58;
  byte c;
  size_t i;
  undefined1 local_48 [7];
  bool hadErrors;
  Vector<char32_t> result;
  undefined1 auStack_20 [7];
  bool nulTerminate_local;
  ArrayPtr<const_char> text_local;
  
  text_local.ptr = text.ptr;
  result.builder.disposer._7_1_ = (byte)text.size_ & 1;
  _auStack_20 = this;
  text_local.size_ = (size_t)__return_storage_ptr__;
  sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
  Vector<char32_t>::Vector((Vector<char32_t> *)local_48,sVar2 + (result.builder.disposer._7_1_ & 1))
  ;
  i._7_1_ = 0;
  sStack_58 = 0;
LAB_0042c95b:
  while( true ) {
    uVar1 = sStack_58;
    sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
    sVar2 = sStack_58;
    if (sVar3 <= uVar1) {
      if ((result.builder.disposer._7_1_ & 1) != 0) {
        local_84[0] = 0;
        Vector<char32_t>::add<int>((Vector<char32_t> *)local_48,local_84);
      }
      Vector<char32_t>::releaseAsArray(&local_a0,(Vector<char32_t> *)local_48);
      EncodingResult<kj::Array<char32_t>_>::EncodingResult
                (__return_storage_ptr__,&local_a0,(bool)(i._7_1_ & 1));
      Array<char32_t>::~Array(&local_a0);
      Vector<char32_t>::~Vector((Vector<char32_t> *)local_48);
      return __return_storage_ptr__;
    }
    sStack_58 = sStack_58 + 1;
    pbVar4 = (byte *)ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_20,sVar2);
    sVar2 = sStack_58;
    local_59 = *pbVar4;
    if (0x7f < local_59) break;
    Vector<char32_t>::add<unsigned_char&>((Vector<char32_t> *)local_48,&local_59);
  }
  if (0xbf < local_59) {
    if (local_59 < 0xe0) {
      sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
      bVar8 = true;
      if (sVar2 != sVar3) {
        pbVar4 = (byte *)ArrayPtr<const_char>::operator[]
                                   ((ArrayPtr<const_char> *)auStack_20,sStack_58);
        c2_2 = *pbVar4;
        bVar8 = (c2_2 & 0xc0) != 0x80;
      }
      if (bVar8) goto LAB_0042ce6e;
      sStack_58 = sStack_58 + 1;
      cStack_70 = (local_59 & 0x1f) << 6 | c2_2 & 0x3f;
      if (0x7f < (ushort)cStack_70) {
        Vector<char32_t>::add<char16_t&>((Vector<char32_t> *)local_48,&stack0xffffffffffffff90);
        goto LAB_0042c95b;
      }
    }
    else {
      if (0xef < local_59) {
        if (0xf7 < local_59) goto LAB_0042ce6e;
        sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
        bVar8 = true;
        if (sVar2 != sVar3) {
          pbVar4 = (byte *)ArrayPtr<const_char>::operator[]
                                     ((ArrayPtr<const_char> *)auStack_20,sStack_58);
          local_75 = *pbVar4;
          bVar8 = (local_75 & 0xc0) != 0x80;
        }
        if (bVar8) goto LAB_0042ce6e;
        sVar2 = sStack_58 + 1;
        sStack_58 = sVar2;
        sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
        bVar8 = true;
        if (sVar2 != sVar3) {
          pbVar4 = (byte *)ArrayPtr<const_char>::operator[]
                                     ((ArrayPtr<const_char> *)auStack_20,sStack_58);
          local_76 = *pbVar4;
          bVar8 = (local_76 & 0xc0) != 0x80;
        }
        if (bVar8) goto LAB_0042ce6e;
        sVar2 = sStack_58 + 1;
        sStack_58 = sVar2;
        sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
        bVar8 = true;
        if (sVar2 != sVar3) {
          pbVar4 = (byte *)ArrayPtr<const_char>::operator[]
                                     ((ArrayPtr<const_char> *)auStack_20,sStack_58);
          local_77 = *pbVar4;
          bVar8 = (local_77 & 0xc0) != 0x80;
        }
        if (bVar8) goto LAB_0042ce6e;
        sStack_58 = sStack_58 + 1;
        local_7c = (local_59 & 7) << 0x12 | (local_75 & 0x3f) << 0xc | (local_76 & 0x3f) << 6 |
                   local_77 & 0x3f;
        if (((uint)local_7c < 0x10000) || (0x10ffff < (uint)local_7c)) goto LAB_0042ce6e;
        addChar32((Vector<char32_t> *)local_48,local_7c);
        goto LAB_0042c95b;
      }
      sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
      bVar8 = true;
      if (sVar2 != sVar3) {
        pbVar4 = (byte *)ArrayPtr<const_char>::operator[]
                                   ((ArrayPtr<const_char> *)auStack_20,sStack_58);
        u_2._3_1_ = *pbVar4;
        bVar8 = (u_2._3_1_ & 0xc0) != 0x80;
      }
      if (!bVar8) {
        sVar2 = sStack_58 + 1;
        sStack_58 = sVar2;
        sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
        bVar8 = true;
        if (sVar2 != sVar3) {
          pbVar4 = (byte *)ArrayPtr<const_char>::operator[]
                                     ((ArrayPtr<const_char> *)auStack_20,sStack_58);
          u_2._2_1_ = *pbVar4;
          bVar8 = (u_2._2_1_ & 0xc0) != 0x80;
        }
        if (bVar8) goto LAB_0042ce6e;
        sStack_58 = sStack_58 + 1;
        uVar7 = (u_2._3_1_ & 0x3f) << 6;
        u_2._0_2_ = (ushort)local_59 << 0xc | uVar7 | u_2._2_1_ & 0x3f;
        if (0x7ff < (ushort)u_2) {
          if ((ushort)((ushort)local_59 << 0xc | uVar7 & 0xf800) == 0xd800) {
            sVar2 = Vector<char32_t>::size((Vector<char32_t> *)local_48);
            if (((sVar2 != 0) && (((ushort)u_2 & 0xfc00) == 0xdc00)) &&
               (pcVar5 = Vector<char32_t>::back((Vector<char32_t> *)local_48),
               (*pcVar5 & 0xfc00U) == 0xd800)) goto LAB_0042ce6e;
            i._7_1_ = 1;
          }
          Vector<char32_t>::add<char16_t&>((Vector<char32_t> *)local_48,(char16_t *)&u_2);
          goto LAB_0042c95b;
        }
      }
    }
  }
LAB_0042ce6e:
  local_84[1] = 0xfffd;
  Vector<char32_t>::add<int>((Vector<char32_t> *)local_48,local_84 + 1);
  i._7_1_ = 1;
  while( true ) {
    uVar1 = sStack_58;
    sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
    bVar8 = false;
    if (uVar1 < sVar2) {
      pcVar6 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_20,sStack_58);
      bVar8 = ((int)*pcVar6 & 0xc0U) == 0x80;
    }
    if (!bVar8) break;
    sStack_58 = sStack_58 + 1;
  }
  goto LAB_0042c95b;
}

Assistant:

EncodingResult<Array<T>> encodeUtf(ArrayPtr<const char> text, bool nulTerminate) {
  Vector<T> result(text.size() + nulTerminate);
  bool hadErrors = false;

  size_t i = 0;
  while (i < text.size()) {
    byte c = text[i++];
    if (c < 0x80) {
      // 0xxxxxxx -- ASCII
      result.add(c);
      continue;
    } else if (KJ_UNLIKELY(c < 0xc0)) {
      // 10xxxxxx -- malformed continuation byte
      goto error;
    } else if (c < 0xe0) {
      // 110xxxxx -- 2-byte
      byte c2;
      GOTO_ERROR_IF(i == text.size() || ((c2 = text[i]) & 0xc0) != 0x80); ++i;
      char16_t u = (static_cast<char16_t>(c  & 0x1f) <<  6)
                 | (static_cast<char16_t>(c2 & 0x3f)      );

      // Disallow overlong sequence.
      GOTO_ERROR_IF(u < 0x80);

      result.add(u);
      continue;
    } else if (c < 0xf0) {
      // 1110xxxx -- 3-byte
      byte c2, c3;
      GOTO_ERROR_IF(i == text.size() || ((c2 = text[i]) & 0xc0) != 0x80); ++i;
      GOTO_ERROR_IF(i == text.size() || ((c3 = text[i]) & 0xc0) != 0x80); ++i;
      char16_t u = (static_cast<char16_t>(c  & 0x0f) << 12)
                 | (static_cast<char16_t>(c2 & 0x3f) <<  6)
                 | (static_cast<char16_t>(c3 & 0x3f)      );

      // Disallow overlong sequence.
      GOTO_ERROR_IF(u < 0x0800);

      // Flag surrogate pair code points as errors, but allow them through.
      if (KJ_UNLIKELY((u & 0xf800) == 0xd800)) {
        if (result.size() > 0 &&
            (u & 0xfc00) == 0xdc00 &&
            (result.back() & 0xfc00) == 0xd800) {
          // Whoops, the *previous* character was also an invalid surrogate, and if we add this
          // one too, they'll form a valid surrogate pair. If we allowed this, then it would mean
          // invalid UTF-8 round-tripped to UTF-16 and back could actually change meaning entirely.
          // OTOH, the reason we allow dangling surrogates is to allow invalid UTF-16 to round-trip
          // to UTF-8 without loss, but if the original UTF-16 had a valid surrogate pair, it would
          // have been encoded as a valid single UTF-8 codepoint, not as separate UTF-8 codepoints
          // for each surrogate.
          goto error;
        }

        hadErrors = true;
      }

      result.add(u);
      continue;
    } else if (c < 0xf8) {
      // 11110xxx -- 4-byte
      byte c2, c3, c4;
      GOTO_ERROR_IF(i == text.size() || ((c2 = text[i]) & 0xc0) != 0x80); ++i;
      GOTO_ERROR_IF(i == text.size() || ((c3 = text[i]) & 0xc0) != 0x80); ++i;
      GOTO_ERROR_IF(i == text.size() || ((c4 = text[i]) & 0xc0) != 0x80); ++i;
      char32_t u = (static_cast<char32_t>(c  & 0x07) << 18)
                 | (static_cast<char32_t>(c2 & 0x3f) << 12)
                 | (static_cast<char32_t>(c3 & 0x3f) <<  6)
                 | (static_cast<char32_t>(c4 & 0x3f)      );

      // Disallow overlong sequence.
      GOTO_ERROR_IF(u < 0x10000);

      // Unicode ends at U+10FFFF
      GOTO_ERROR_IF(u >= 0x110000);

      addChar32(result, u);
      continue;
    } else {
      // 5-byte and 6-byte sequences are not legal as they'd result in codepoints outside the
      // range of Unicode.
      goto error;
    }

  error:
    result.add(0xfffd);
    hadErrors = true;
    // Ignore all continuation bytes.
    while (i < text.size() && (text[i] & 0xc0) == 0x80) {
      ++i;
    }
  }

  if (nulTerminate) result.add(0);

  return { result.releaseAsArray(), hadErrors };
}